

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::GetReservedOutputAttributesForElement
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *xml_element)

{
  bool bVar1;
  ostream *poVar2;
  char *(*extraout_RDX) [8];
  char *(*extraout_RDX_00) [8];
  char *(*array) [8];
  char *(*array_00) [10];
  undefined1 *this;
  GTestLog local_14;
  
  bVar1 = std::operator==(xml_element,"testsuites");
  if (bVar1) {
    this = kReservedTestSuitesAttributes;
    array = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(xml_element,"testsuite");
    if (!bVar1) {
      bVar1 = std::operator==(xml_element,"testcase");
      if (bVar1) {
        ArrayAsVector<10ul>(__return_storage_ptr__,(testing *)kReservedOutputTestCaseAttributes,
                            array_00);
        return __return_storage_ptr__;
      }
      internal::GTestLog::GTestLog
                (&local_14,GTEST_FATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                 ,0x94f);
      poVar2 = std::operator<<((ostream *)&std::cerr,"Condition false failed. ");
      poVar2 = std::operator<<(poVar2,"Unrecognized xml_element provided: ");
      std::operator<<(poVar2,(string *)xml_element);
      internal::GTestLog::~GTestLog(&local_14);
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    this = kReservedTestSuiteAttributes;
    array = extraout_RDX_00;
  }
  ArrayAsVector<8ul>(__return_storage_ptr__,(testing *)this,array);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> GetReservedOutputAttributesForElement(
    const std::string& xml_element) {
  if (xml_element == "testsuites") {
    return ArrayAsVector(kReservedTestSuitesAttributes);
  } else if (xml_element == "testsuite") {
    return ArrayAsVector(kReservedTestSuiteAttributes);
  } else if (xml_element == "testcase") {
    return ArrayAsVector(kReservedOutputTestCaseAttributes);
  } else {
    GTEST_CHECK_(false) << "Unrecognized xml_element provided: " << xml_element;
  }
  // This code is unreachable but some compilers may not realizes that.
  return std::vector<std::string>();
}